

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O2

void __thiscall
ConcurrentStack<Door_*>::ConcurrentStack(ConcurrentStack<Door_*> *this,size_t capacity)

{
  std::stack<Door*,std::deque<Door*,std::allocator<Door*>>>::
  stack<std::deque<Door*,std::allocator<Door*>>,void>(&this->stack_);
  this->max_size_ = capacity;
  this->bounded_ = capacity != 0;
  (this->timeout_).__r = 0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->queue_full_);
  std::condition_variable::condition_variable(&this->queue_empty_);
  return;
}

Assistant:

ConcurrentStack(const size_t capacity = 10) :
            max_size_(capacity), bounded_(capacity > 0) {}